

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall QPDFJob::setWriterOptions(QPDFJob *this,QPDFWriter *w)

{
  unique_ptr<QPDF,_std::default_delete<QPDF>_> uVar1;
  bool bVar2;
  element_type *peVar3;
  char *filename;
  element_type *password;
  type qpdf;
  ulong uVar4;
  FunctionProgressReporter *this_00;
  ProgressReporter *this_01;
  element_type *peVar5;
  element_type *p;
  char *local_178;
  QPDFLogger local_e0;
  shared_ptr<QPDFWriter::ProgressReporter> local_d0;
  char *local_c0;
  char *outfilename;
  function<void_(int)> local_b0;
  shared_ptr<QPDFWriter::ProgressReporter> local_90;
  int local_7c;
  undefined1 local_78 [4];
  int extension_level_1;
  string version_1;
  undefined1 local_50 [4];
  int extension_level;
  string version;
  unique_ptr<QPDF,_std::default_delete<QPDF>_> local_20;
  unique_ptr<QPDF,_std::default_delete<QPDF>_> encryption_pdf;
  QPDFWriter *w_local;
  QPDFJob *this_local;
  
  encryption_pdf._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
  super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.super__Head_base<0UL,_QPDF_*,_false>.
  _M_head_impl = (__uniq_ptr_data<QPDF,_std::default_delete<QPDF>,_true,_true>)
                 (__uniq_ptr_data<QPDF,_std::default_delete<QPDF>,_true,_true>)w;
  peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if (-1 < peVar3->compression_level) {
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    Pl_Flate::setCompressionLevel(peVar3->compression_level);
  }
  peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar3->qdf_mode & 1U) != 0) {
    QPDFWriter::setQDFMode
              ((QPDFWriter *)
               encryption_pdf._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
               super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
               super__Head_base<0UL,_QPDF_*,_false>._M_head_impl,true);
  }
  peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar3->preserve_unreferenced_objects & 1U) != 0) {
    QPDFWriter::setPreserveUnreferencedObjects
              ((QPDFWriter *)
               encryption_pdf._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
               super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
               super__Head_base<0UL,_QPDF_*,_false>._M_head_impl,true);
  }
  peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar3->newline_before_endstream & 1U) != 0) {
    QPDFWriter::setNewlineBeforeEndstream
              ((QPDFWriter *)
               encryption_pdf._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
               super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
               super__Head_base<0UL,_QPDF_*,_false>._M_head_impl,true);
  }
  peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  uVar1 = encryption_pdf;
  if ((peVar3->normalize_set & 1U) != 0) {
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    QPDFWriter::setContentNormalization
              ((QPDFWriter *)
               uVar1._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
               super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
               super__Head_base<0UL,_QPDF_*,_false>._M_head_impl,(bool)(peVar3->normalize & 1));
  }
  peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  uVar1 = encryption_pdf;
  if ((peVar3->stream_data_set & 1U) != 0) {
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    QPDFWriter::setStreamDataMode
              ((QPDFWriter *)
               uVar1._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
               super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
               super__Head_base<0UL,_QPDF_*,_false>._M_head_impl,peVar3->stream_data_mode);
  }
  peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  uVar1 = encryption_pdf;
  if ((peVar3->compress_streams_set & 1U) != 0) {
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    QPDFWriter::setCompressStreams
              ((QPDFWriter *)
               uVar1._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
               super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
               super__Head_base<0UL,_QPDF_*,_false>._M_head_impl,
               (bool)(peVar3->compress_streams & 1));
  }
  peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  uVar1 = encryption_pdf;
  if ((peVar3->recompress_flate_set & 1U) != 0) {
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    QPDFWriter::setRecompressFlate
              ((QPDFWriter *)
               uVar1._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
               super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
               super__Head_base<0UL,_QPDF_*,_false>._M_head_impl,
               (bool)(peVar3->recompress_flate & 1));
  }
  peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  uVar1 = encryption_pdf;
  if ((peVar3->decode_level_set & 1U) != 0) {
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    QPDFWriter::setDecodeLevel
              ((QPDFWriter *)
               uVar1._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
               super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
               super__Head_base<0UL,_QPDF_*,_false>._M_head_impl,peVar3->decode_level);
  }
  peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar3->decrypt & 1U) != 0) {
    QPDFWriter::setPreserveEncryption
              ((QPDFWriter *)
               encryption_pdf._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
               super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
               super__Head_base<0UL,_QPDF_*,_false>._M_head_impl,false);
  }
  peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar3->deterministic_id & 1U) != 0) {
    QPDFWriter::setDeterministicID
              ((QPDFWriter *)
               encryption_pdf._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
               super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
               super__Head_base<0UL,_QPDF_*,_false>._M_head_impl,true);
  }
  peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar3->static_id & 1U) != 0) {
    QPDFWriter::setStaticID
              ((QPDFWriter *)
               encryption_pdf._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
               super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
               super__Head_base<0UL,_QPDF_*,_false>._M_head_impl,true);
  }
  peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar3->static_aes_iv & 1U) != 0) {
    QPDFWriter::setStaticAesIV
              ((QPDFWriter *)
               encryption_pdf._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
               super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
               super__Head_base<0UL,_QPDF_*,_false>._M_head_impl,true);
  }
  peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar3->suppress_original_object_id & 1U) != 0) {
    QPDFWriter::setSuppressOriginalObjectIDs
              ((QPDFWriter *)
               encryption_pdf._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
               super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
               super__Head_base<0UL,_QPDF_*,_false>._M_head_impl,true);
  }
  peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar3->copy_encryption & 1U) != 0) {
    std::unique_ptr<QPDF,std::default_delete<QPDF>>::unique_ptr<std::default_delete<QPDF>,void>
              ((unique_ptr<QPDF,std::default_delete<QPDF>> *)&local_20);
    std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               this);
    filename = (char *)std::__cxx11::string::c_str();
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    password = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                         (&(peVar3->encryption_file_password).
                           super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>);
    processFile(this,&local_20,filename,password,false,false);
    uVar1 = encryption_pdf;
    qpdf = std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::operator*(&local_20);
    QPDFWriter::copyEncryptionParameters
              ((QPDFWriter *)
               uVar1._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
               super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
               super__Head_base<0UL,_QPDF_*,_false>._M_head_impl,qpdf);
    std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::~unique_ptr(&local_20);
  }
  peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar3->encrypt & 1U) != 0) {
    setEncryptionOptions
              (this,(QPDFWriter *)
                    encryption_pdf._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t
                    .super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
                    super__Head_base<0UL,_QPDF_*,_false>._M_head_impl);
  }
  peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar3->linearize & 1U) != 0) {
    QPDFWriter::setLinearization
              ((QPDFWriter *)
               encryption_pdf._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
               super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
               super__Head_base<0UL,_QPDF_*,_false>._M_head_impl,true);
  }
  std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this
            );
  uVar4 = std::__cxx11::string::empty();
  uVar1 = encryption_pdf;
  if ((uVar4 & 1) == 0) {
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    QPDFWriter::setLinearizationPass1Filename
              ((QPDFWriter *)
               uVar1._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
               super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
               super__Head_base<0UL,_QPDF_*,_false>._M_head_impl,&peVar3->linearize_pass1);
  }
  peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  uVar1 = encryption_pdf;
  if ((peVar3->object_stream_set & 1U) != 0) {
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    QPDFWriter::setObjectStreamMode
              ((QPDFWriter *)
               uVar1._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
               super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
               super__Head_base<0UL,_QPDF_*,_false>._M_head_impl,peVar3->object_stream_mode);
  }
  uVar1._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
  super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.super__Head_base<0UL,_QPDF_*,_false>.
  _M_head_impl = encryption_pdf._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
                 super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
                 super__Head_base<0UL,_QPDF_*,_false>._M_head_impl;
  peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  QPDFWriter::setMinimumPDFVersion
            ((QPDFWriter *)
             uVar1._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
             super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
             super__Head_base<0UL,_QPDF_*,_false>._M_head_impl,&peVar3->max_input_version);
  std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this
            );
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::string::string((string *)local_50);
    version_1.field_2._12_4_ = 0;
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    parse_version(&peVar3->min_version,(string *)local_50,
                  (int *)(version_1.field_2._M_local_buf + 0xc));
    QPDFWriter::setMinimumPDFVersion
              ((QPDFWriter *)
               encryption_pdf._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
               super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
               super__Head_base<0UL,_QPDF_*,_false>._M_head_impl,(string *)local_50,
               version_1.field_2._12_4_);
    std::__cxx11::string::~string((string *)local_50);
  }
  std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this
            );
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::string::string((string *)local_78);
    local_7c = 0;
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    parse_version(&peVar3->force_version,(string *)local_78,&local_7c);
    QPDFWriter::forcePDFVersion
              ((QPDFWriter *)
               encryption_pdf._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
               super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
               super__Head_base<0UL,_QPDF_*,_false>._M_head_impl,(string *)local_78,local_7c);
    std::__cxx11::string::~string((string *)local_78);
  }
  peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar3->progress & 1U) != 0) {
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    bVar2 = std::function::operator_cast_to_bool((function *)&peVar3->progress_handler);
    uVar1 = encryption_pdf;
    if (bVar2) {
      this_00 = (FunctionProgressReporter *)operator_new(0x28);
      outfilename._7_1_ = 1;
      peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::function<void_(int)>::function(&local_b0,&peVar3->progress_handler);
      QPDFWriter::FunctionProgressReporter::FunctionProgressReporter(this_00,&local_b0);
      outfilename._7_1_ = 0;
      std::shared_ptr<QPDFWriter::ProgressReporter>::
      shared_ptr<QPDFWriter::FunctionProgressReporter,void>(&local_90,this_00);
      QPDFWriter::registerProgressReporter
                ((QPDFWriter *)
                 uVar1._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
                 super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
                 super__Head_base<0UL,_QPDF_*,_false>._M_head_impl,&local_90);
      std::shared_ptr<QPDFWriter::ProgressReporter>::~shared_ptr(&local_90);
      std::function<void_(int)>::~function(&local_b0);
    }
    else {
      peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar3->outfilename);
      if (bVar2) {
        peVar3 = std::
                 __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        local_178 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                              (&(peVar3->outfilename).
                                super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>);
      }
      else {
        local_178 = "standard output";
      }
      uVar1._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
      super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
      super__Head_base<0UL,_QPDF_*,_false>._M_head_impl =
           encryption_pdf._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
           super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
           super__Head_base<0UL,_QPDF_*,_false>._M_head_impl;
      local_c0 = local_178;
      this_01 = (ProgressReporter *)operator_new(0x50);
      peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      peVar5 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)peVar3);
      QPDFLogger::getInfo(&local_e0,SUB81(peVar5,0));
      p = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                    ((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     &local_e0);
      peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      anon_unknown.dwarf_245d8c::ProgressReporter::ProgressReporter
                (this_01,p,&peVar3->message_prefix,local_c0);
      std::shared_ptr<QPDFWriter::ProgressReporter>::
      shared_ptr<(anonymous_namespace)::ProgressReporter,void>(&local_d0,this_01);
      QPDFWriter::registerProgressReporter
                ((QPDFWriter *)
                 uVar1._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
                 super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
                 super__Head_base<0UL,_QPDF_*,_false>._M_head_impl,&local_d0);
      std::shared_ptr<QPDFWriter::ProgressReporter>::~shared_ptr(&local_d0);
      std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)&local_e0);
    }
  }
  return;
}

Assistant:

void
QPDFJob::setWriterOptions(QPDFWriter& w)
{
    if (m->compression_level >= 0) {
        Pl_Flate::setCompressionLevel(m->compression_level);
    }
    if (m->qdf_mode) {
        w.setQDFMode(true);
    }
    if (m->preserve_unreferenced_objects) {
        w.setPreserveUnreferencedObjects(true);
    }
    if (m->newline_before_endstream) {
        w.setNewlineBeforeEndstream(true);
    }
    if (m->normalize_set) {
        w.setContentNormalization(m->normalize);
    }
    if (m->stream_data_set) {
        w.setStreamDataMode(m->stream_data_mode);
    }
    if (m->compress_streams_set) {
        w.setCompressStreams(m->compress_streams);
    }
    if (m->recompress_flate_set) {
        w.setRecompressFlate(m->recompress_flate);
    }
    if (m->decode_level_set) {
        w.setDecodeLevel(m->decode_level);
    }
    if (m->decrypt) {
        w.setPreserveEncryption(false);
    }
    if (m->deterministic_id) {
        w.setDeterministicID(true);
    }
    if (m->static_id) {
        w.setStaticID(true);
    }
    if (m->static_aes_iv) {
        w.setStaticAesIV(true);
    }
    if (m->suppress_original_object_id) {
        w.setSuppressOriginalObjectIDs(true);
    }
    if (m->copy_encryption) {
        std::unique_ptr<QPDF> encryption_pdf;
        processFile(
            encryption_pdf,
            m->encryption_file.c_str(),
            m->encryption_file_password.get(),
            false,
            false);
        w.copyEncryptionParameters(*encryption_pdf);
    }
    if (m->encrypt) {
        setEncryptionOptions(w);
    }
    if (m->linearize) {
        w.setLinearization(true);
    }
    if (!m->linearize_pass1.empty()) {
        w.setLinearizationPass1Filename(m->linearize_pass1);
    }
    if (m->object_stream_set) {
        w.setObjectStreamMode(m->object_stream_mode);
    }
    w.setMinimumPDFVersion(m->max_input_version);
    if (!m->min_version.empty()) {
        std::string version;
        int extension_level = 0;
        parse_version(m->min_version, version, extension_level);
        w.setMinimumPDFVersion(version, extension_level);
    }
    if (!m->force_version.empty()) {
        std::string version;
        int extension_level = 0;
        parse_version(m->force_version, version, extension_level);
        w.forcePDFVersion(version, extension_level);
    }
    if (m->progress) {
        if (m->progress_handler) {
            w.registerProgressReporter(
                std::shared_ptr<QPDFWriter::ProgressReporter>(
                    new QPDFWriter::FunctionProgressReporter(m->progress_handler)));
        } else {
            char const* outfilename = m->outfilename ? m->outfilename.get() : "standard output";
            w.registerProgressReporter(
                std::shared_ptr<QPDFWriter::ProgressReporter>(
                    // line-break
                    new ProgressReporter(*m->log->getInfo(), m->message_prefix, outfilename)));
        }
    }
}